

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::ShaderLibraryCase::iterate(ShaderLibraryCase *this)

{
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  execute(this);
  return STOP;
}

Assistant:

TestCase::IterateResult ShaderLibraryCase::iterate (void)
{
	// Initialize state to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	bool executeOk = execute();

	DE_ASSERT(executeOk ? m_testCtx.getTestResult() == QP_TEST_RESULT_PASS : m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);
	DE_UNREF(executeOk);
	return TestCase::STOP;
}